

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O2

int tr_recv_all(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  time_t cur_time;
  time_t end_time;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_get_monotonic_time(&local_40);
  local_40 = local_40 + timeout;
  uVar2 = 0;
  do {
    if (len < uVar2 || len - uVar2 == 0) {
      uVar1 = (uint)uVar2;
      break;
    }
    lrtr_get_monotonic_time(&local_48);
    uVar1 = (*socket->recv_fp)(socket->socket,(void *)((long)pdu + uVar2),len - uVar2,
                               local_40 - local_48);
    uVar2 = uVar2 + uVar1;
  } while (-1 < (int)uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int tr_recv_all(const struct tr_socket *socket, const void *pdu, const size_t len, const time_t timeout)
{
	size_t total_recv = 0;
	time_t end_time;

	lrtr_get_monotonic_time(&end_time);
	end_time += timeout;

	while (total_recv < len) {
		time_t cur_time;
		int rtval;

		lrtr_get_monotonic_time(&cur_time);

		rtval = tr_recv(socket, ((char *)pdu) + total_recv, (len - total_recv), end_time - cur_time);
		if (rtval < 0)
			return rtval;
		total_recv += rtval;
	}
	return total_recv;
}